

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O0

AnalyzerChannelData * __thiscall SMBusAnalyzer::GetNearestTransitionChannel(SMBusAnalyzer *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte local_31;
  U64 next_dat_edge;
  U64 next_clk_edge;
  SMBusAnalyzer *this_local;
  
  do {
    uVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    local_31 = 0;
    if ((uVar1 & 1) == 0) {
      local_31 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      local_31 = local_31 ^ 0xff;
    }
  } while ((local_31 & 1) != 0);
  uVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if ((uVar2 & 1) == 0) {
    AnalyzerChannelData::GetSampleOfNextEdge();
    uVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                      ((ulonglong)this->mSMBDAT);
    if ((uVar2 & 1) == 0) {
      return this->mSMBCLK;
    }
  }
  uVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if ((uVar2 & 1) == 0) {
    AnalyzerChannelData::GetSampleOfNextEdge();
    uVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                      ((ulonglong)this->mSMBCLK);
    if ((uVar2 & 1) == 0) {
      return this->mSMBDAT;
    }
  }
  uVar2 = AnalyzerChannelData::GetSampleOfNextEdge();
  uVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
  if (uVar2 < uVar3) {
    this_local = (SMBusAnalyzer *)this->mSMBDAT;
  }
  else {
    this_local = (SMBusAnalyzer *)this->mSMBCLK;
  }
  return (AnalyzerChannelData *)this_local;
}

Assistant:

AnalyzerChannelData* SMBusAnalyzer::GetNearestTransitionChannel()
{
    // if neither channel has more transitions, block for more data.
    while( !mSMBDAT->DoMoreTransitionsExistInCurrentData() && !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        // DoMoreTransitionsExistInCurrentData will block for up to 250ms waiting for more data, and it will trigger a thread exit if the
        // capture ends and there is still no more data.
    }

    if( !mSMBDAT->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_clk_edge = mSMBCLK->GetSampleOfNextEdge();
        if( !mSMBDAT->WouldAdvancingToAbsPositionCauseTransition( next_clk_edge ) )
        {
            return mSMBCLK;
        }
    }

    if( !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_dat_edge = mSMBDAT->GetSampleOfNextEdge();
        if( !mSMBCLK->WouldAdvancingToAbsPositionCauseTransition( next_dat_edge ) )
        {
            return mSMBDAT;
        }
    }

    if( mSMBDAT->GetSampleOfNextEdge() < mSMBCLK->GetSampleOfNextEdge() )
        return mSMBDAT;

    return mSMBCLK;
}